

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O1

void __thiscall
duckdb::CopyToFunctionLocalState::AppendToPartition
          (CopyToFunctionLocalState *this,ExecutionContext *context,PhysicalCopyToFile *op,
          CopyToFunctionGlobalState *g,DataChunk *chunk)

{
  pointer this_00;
  type state;
  ClientConfig *pCVar1;
  ulong uVar2;
  
  if ((this->part_buffer).
      super_unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::HivePartitionedColumnData_*,_std::default_delete<duckdb::HivePartitionedColumnData>_>
      .super__Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false>._M_head_impl ==
      (HivePartitionedColumnData *)0x0) {
    InitializeAppendState(this,context->client,op,g);
  }
  this_00 = unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>,_true>
            ::operator->(&this->part_buffer);
  state = unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>
          ::operator*(&this->part_buffer_append_state);
  PartitionedColumnData::Append(&this_00->super_PartitionedColumnData,state,chunk);
  uVar2 = this->append_count + chunk->count;
  this->append_count = uVar2;
  pCVar1 = ClientConfig::GetConfig(context->client);
  if (uVar2 < pCVar1->partitioned_write_flush_threshold) {
    return;
  }
  FlushPartitions(this,context,op,g);
  return;
}

Assistant:

void AppendToPartition(ExecutionContext &context, const PhysicalCopyToFile &op, CopyToFunctionGlobalState &g,
	                       DataChunk &chunk) {
		if (!part_buffer) {
			// re-initialize the append
			InitializeAppendState(context.client, op, g);
		}
		part_buffer->Append(*part_buffer_append_state, chunk);
		append_count += chunk.size();
		if (append_count >= ClientConfig::GetConfig(context.client).partitioned_write_flush_threshold) {
			// flush all cached partitions
			FlushPartitions(context, op, g);
		}
	}